

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir-gen.c
# Opt level: O0

int ssa_dead_insn_p(gen_ctx_t gen_ctx,bb_insn_t_conflict bb_insn)

{
  int iVar1;
  bb_insn_t_conflict bb_insn_00;
  ssa_edge_t_conflict ssa_edge;
  insn_var_iterator_t iter;
  int local_30;
  MIR_reg_t var;
  int output_exists_p;
  int op_num;
  MIR_insn_t insn;
  bb_insn_t_conflict bb_insn_local;
  gen_ctx_t gen_ctx_local;
  
  _output_exists_p = bb_insn->insn;
  local_30 = 0;
  insn = (MIR_insn_t)bb_insn;
  bb_insn_local = (bb_insn_t_conflict)gen_ctx;
  iVar1 = MIR_call_code_p((MIR_insn_code_t)*(undefined8 *)&_output_exists_p->field_0x18);
  if ((((((iVar1 == 0) && ((int)*(undefined8 *)&_output_exists_p->field_0x18 != 0xad)) &&
        ((int)*(undefined8 *)&_output_exists_p->field_0x18 != 0xae)) &&
       (((int)*(undefined8 *)&_output_exists_p->field_0x18 != 0xb2 &&
        ((int)*(undefined8 *)&_output_exists_p->field_0x18 != 0xb0)))) &&
      ((((int)((ulong)*(undefined8 *)&_output_exists_p->field_0x18 >> 0x20) == 0 ||
        ((*(ushort *)&_output_exists_p->ops[0].field_0x8 & 0xff) != 2)) ||
       ((_output_exists_p->ops[0].u.reg != 5 && (_output_exists_p->ops[0].u.reg != 4)))))) &&
     (iVar1 = fake_insn_p((bb_insn_t_conflict)insn), iVar1 == 0)) {
    insn_var_iterator_init((insn_var_iterator_t *)&ssa_edge,_output_exists_p);
    do {
      iVar1 = output_insn_var_iterator_next
                        ((gen_ctx_t)bb_insn_local,(insn_var_iterator_t *)&ssa_edge,
                         (MIR_reg_t *)((long)&iter.op_part_num + 4),(int *)&var);
      if (iVar1 == 0) {
        iVar1 = MIR_overflow_insn_code_p
                          ((MIR_insn_code_t)*(undefined8 *)&_output_exists_p->field_0x18);
        if (iVar1 != 0) {
          bb_insn_00 = DLIST_bb_insn_t_next((bb_insn_t_conflict)insn);
          iVar1 = reachable_bo_exists_p(bb_insn_00);
          if (iVar1 != 0) {
            return 0;
          }
        }
        return local_30;
      }
      local_30 = 1;
    } while (((*(ushort *)&_output_exists_p->ops[(int)var].field_0x8 & 0xff) != 0xb) &&
            (_output_exists_p->ops[(int)var].data == (void *)0x0));
  }
  return 0;
}

Assistant:

static int ssa_dead_insn_p (gen_ctx_t gen_ctx, bb_insn_t bb_insn) {
  MIR_insn_t insn = bb_insn->insn;
  int op_num, output_exists_p = FALSE;
  MIR_reg_t var;
  insn_var_iterator_t iter;
  ssa_edge_t ssa_edge;

  /* check control insns with possible output: */
  if (MIR_call_code_p (insn->code) || insn->code == MIR_ALLOCA || insn->code == MIR_BSTART
      || insn->code == MIR_VA_START || insn->code == MIR_VA_ARG
      || (insn->nops > 0 && insn->ops[0].mode == MIR_OP_VAR
          && (insn->ops[0].u.var == FP_HARD_REG || insn->ops[0].u.var == SP_HARD_REG)))
    return FALSE;
  if (fake_insn_p (bb_insn)) return FALSE;
  FOREACH_OUT_INSN_VAR (gen_ctx, iter, insn, var, op_num) {
    output_exists_p = TRUE;
    if (insn->ops[op_num].mode == MIR_OP_VAR_MEM || (ssa_edge = insn->ops[op_num].data) != NULL)
      return FALSE;
  }
  if (!MIR_overflow_insn_code_p (insn->code)
      || !reachable_bo_exists_p (DLIST_NEXT (bb_insn_t, bb_insn)))
    return output_exists_p;
  return FALSE;
}